

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O3

int ichol(double *A,int N)

{
  long lVar1;
  double dVar2;
  double *C;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __n;
  double *pdVar11;
  ulong uVar12;
  double dVar13;
  
  uVar9 = (ulong)N;
  C = (double *)malloc(uVar9 * uVar9 * 8);
  pdVar11 = A;
  if (N != 1) {
    uVar12 = (ulong)(N - 1);
    pdVar7 = A + (N + 1);
    uVar10 = uVar9;
    do {
      dVar13 = *pdVar11;
      if (dVar13 < 0.0) {
        iVar8 = -1;
        goto LAB_001396bb;
      }
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      *pdVar11 = dVar13;
      if ((long)uVar10 < 2) {
        iVar8 = (int)uVar10 + -1;
        mmult(pdVar11 + 1,pdVar11 + 1,C,iVar8,1,iVar8);
      }
      else {
        uVar4 = 1;
        do {
          dVar2 = pdVar11[uVar4];
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            pdVar11[uVar4] = dVar2 / dVar13;
          }
          uVar4 = uVar4 + 1;
        } while ((uVar10 & 0xffffffff) != uVar4);
        iVar8 = (int)(uVar10 - 1);
        mmult(pdVar11 + 1,pdVar11 + 1,C,iVar8,1,iVar8);
        uVar4 = 0;
        pdVar3 = pdVar7;
        pdVar5 = C;
        do {
          lVar6 = 0;
          do {
            dVar13 = pdVar3[lVar6];
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              pdVar3[lVar6] = dVar13 - pdVar5[lVar6];
            }
            lVar1 = uVar4 + lVar6;
            lVar6 = lVar6 + 1;
          } while (lVar1 + 1 < (long)(uVar10 - 1));
          uVar4 = uVar4 + 1;
          pdVar5 = pdVar5 + uVar10;
          pdVar3 = pdVar3 + uVar9 + 1;
        } while (uVar4 != uVar12);
      }
      uVar10 = uVar10 - 1;
      pdVar11 = pdVar11 + uVar9 + 1;
      uVar12 = uVar12 - 1;
      pdVar7 = pdVar7 + uVar9 + 1;
    } while (uVar10 != 1);
  }
  dVar13 = *pdVar11;
  iVar8 = -1;
  if (0.0 < dVar13) {
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    *pdVar11 = dVar13;
    iVar8 = 0;
  }
LAB_001396bb:
  if (0 < N) {
    uVar9 = 0;
    __n = 0;
    do {
      if (__n != 0) {
        memset(A + uVar9,0,__n);
      }
      __n = __n + 8;
      uVar9 = (ulong)(uint)((int)uVar9 + N);
    } while ((ulong)(uint)N << 3 != __n);
  }
  free(C);
  return iVar8;
}

Assistant:

int ichol(double *A, int N) {
	int sc;
	sc = icholu(A,N);
	return sc;
}